

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_snap.c
# Opt level: O2

void lj_snap_shrink(jit_State *J)

{
  uint uVar1;
  BCReg maxslot;
  BCReg BVar2;
  uint32_t uVar3;
  SnapShot *pSVar4;
  SnapEntry *pSVar5;
  BCReg BVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  uint8_t udf [257];
  uint8_t local_138 [264];
  
  pSVar4 = (J->cur).snap;
  uVar8 = (ulong)(J->cur).nsnap;
  uVar1 = pSVar4[uVar8 - 1].mapofs;
  pSVar5 = (J->cur).snapmap;
  uVar12 = (ulong)pSVar4[uVar8 - 1].nent;
  maxslot = J->maxslot;
  BVar2 = J->baseslot;
  BVar6 = snap_usedef(J,local_138,(BCIns *)(*(ulong *)(pSVar5 + uVar1 + uVar12) >> 8),maxslot);
  if (BVar6 < maxslot) {
    snap_useuv(J->pt,local_138);
  }
  pSVar4[uVar8 - 1].nslots = (uint8_t)(maxslot + BVar2);
  uVar7 = 0;
  for (uVar9 = 0; uVar12 != uVar9; uVar9 = uVar9 + 1) {
    uVar10 = pSVar5[uVar1 + uVar9] >> 0x18;
    if ((uVar10 < BVar6 + BVar2) ||
       ((uVar10 < maxslot + BVar2 && (local_138[uVar10 - BVar2] == '\0')))) {
      uVar11 = (ulong)uVar7;
      uVar7 = uVar7 + 1;
      pSVar5[uVar1 + uVar11] = pSVar5[uVar1 + uVar9];
    }
  }
  pSVar4[uVar8 - 1].nent = (uint8_t)uVar7;
  uVar10 = pSVar4[uVar8 - 1].mapofs;
  uVar3 = (J->cur).nsnapmap;
  for (; (uint)uVar12 <= ~uVar10 + uVar3; uVar12 = (ulong)((uint)uVar12 + 1)) {
    uVar9 = (ulong)uVar7;
    uVar7 = uVar7 + 1;
    pSVar5[uVar1 + uVar9] = pSVar5[uVar1 + uVar12];
  }
  (J->cur).nsnapmap = uVar7 + pSVar4[uVar8 - 1].mapofs;
  return;
}

Assistant:

void lj_snap_shrink(jit_State *J)
{
  SnapShot *snap = &J->cur.snap[J->cur.nsnap-1];
  SnapEntry *map = &J->cur.snapmap[snap->mapofs];
  MSize n, m, nlim, nent = snap->nent;
  uint8_t udf[SNAP_USEDEF_SLOTS];
  BCReg maxslot = J->maxslot;
  BCReg baseslot = J->baseslot;
  BCReg minslot = snap_usedef(J, udf, snap_pc(&map[nent]), maxslot);
  if (minslot < maxslot) snap_useuv(J->pt, udf);
  maxslot += baseslot;
  minslot += baseslot;
  snap->nslots = (uint8_t)maxslot;
  for (n = m = 0; n < nent; n++) {  /* Remove unused slots from snapshot. */
    BCReg s = snap_slot(map[n]);
    if (s < minslot || (s < maxslot && udf[s-baseslot] == 0))
      map[m++] = map[n];  /* Only copy used slots. */
  }
  snap->nent = (uint8_t)m;
  nlim = J->cur.nsnapmap - snap->mapofs - 1;
  while (n <= nlim) map[m++] = map[n++];  /* Move PC + frame links down. */
  J->cur.nsnapmap = (uint32_t)(snap->mapofs + m);  /* Free up space in map. */
}